

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulatingstroker.cpp
# Opt level: O0

void __thiscall QTriangulatingStroker::moveTo(QTriangulatingStroker *this,qreal *pts)

{
  int iVar1;
  int iVar2;
  qsizetype qVar3;
  size_type sVar4;
  reference pvVar5;
  float *pfVar6;
  QTriangulatingStroker *in_RSI;
  QTriangulatingStroker *in_RDI;
  long in_FS_OFFSET;
  bool bVar7;
  float cx;
  float cy;
  int end;
  int front;
  int count;
  float sy;
  float sx;
  bool invisibleJump;
  float y2;
  float x2;
  QVarLengthArray<float,_256LL> points;
  float in_stack_fffffffffffffb68;
  float in_stack_fffffffffffffb6c;
  float in_stack_fffffffffffffb70;
  float in_stack_fffffffffffffb74;
  value_type_conflict8 in_stack_fffffffffffffb78;
  value_type_conflict8 in_stack_fffffffffffffb7c;
  float in_stack_fffffffffffffb80;
  value_type_conflict8 vVar8;
  float in_stack_fffffffffffffb84;
  undefined8 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  int iVar9;
  float in_stack_fffffffffffffba8;
  float in_stack_fffffffffffffbac;
  float in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb4;
  float fromX;
  QVarLengthArray<float,_256LL> local_420;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(float *)(in_RDI + 0x18) = (float)*(double *)in_RSI;
  *(float *)(in_RDI + 0x1c) = (float)*(double *)(in_RSI + 8);
  cx = (float)*(double *)(in_RSI + 0x10);
  cy = (float)*(double *)(in_RSI + 0x18);
  normalVector(in_RDI,(float)((ulong)in_stack_fffffffffffffb88 >> 0x20),
               (float)in_stack_fffffffffffffb88,in_stack_fffffffffffffb84,in_stack_fffffffffffffb80,
               (float *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
               (float *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  qVar3 = QDataBuffer<float>::size((QDataBuffer<float> *)in_RDI);
  bVar7 = qVar3 != 0;
  fromX = (float)CONCAT13(bVar7,(int3)in_stack_fffffffffffffbb4);
  iVar2 = *(int *)((QDataBuffer<float> *)in_RDI + 100);
  if (iVar2 == 0) {
    if (bVar7) {
      QDataBuffer<float>::add
                ((QDataBuffer<float> *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70)
                 ,(float *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      QDataBuffer<float>::add
                ((QDataBuffer<float> *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70)
                 ,(float *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    }
  }
  else if (iVar2 == 0x10) {
    if (bVar7) {
      QDataBuffer<float>::add
                ((QDataBuffer<float> *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70)
                 ,(float *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      QDataBuffer<float>::add
                ((QDataBuffer<float> *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70)
                 ,(float *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    }
    emitLineSegment((QTriangulatingStroker *)
                    CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                    in_stack_fffffffffffffb74,in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
                    in_stack_fffffffffffffb68);
  }
  else if (iVar2 == 0x20) {
    memset(&local_420,0xaa,0x418);
    QVarLengthArray<float,_256LL>::QVarLengthArray(&local_420);
    arcPoints(in_RSI,cx,cy,fromX,in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
              in_stack_fffffffffffffba8,
              (QVarLengthArray<float,_256LL> *)
              CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
    QDataBuffer<float>::size((QDataBuffer<float> *)in_RDI);
    QVLABaseBase::size((QVLABaseBase *)&local_420);
    QDataBuffer<float>::resize
              ((QDataBuffer<float> *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    qVar3 = QDataBuffer<float>::size((QDataBuffer<float> *)in_RDI);
    iVar1 = (int)qVar3;
    iVar9 = 0;
    sVar4 = QVLABaseBase::size((QVLABaseBase *)&local_420);
    iVar2 = (int)(sVar4 / 2);
    for (; iVar9 != iVar2; iVar9 = iVar9 + 1) {
      pvVar5 = QVLABase<float>::operator[]
                         ((QVLABase<float> *)
                          CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),0x673981);
      vVar8 = *pvVar5;
      iVar1 = iVar1 + -1;
      pfVar6 = QDataBuffer<float>::at((QDataBuffer<float> *)in_RDI,(long)iVar1);
      *pfVar6 = vVar8;
      pvVar5 = QVLABase<float>::operator[]
                         ((QVLABase<float> *)
                          CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),0x6739c3);
      vVar8 = *pvVar5;
      iVar1 = iVar1 + -1;
      pfVar6 = QDataBuffer<float>::at((QDataBuffer<float> *)in_RDI,(long)iVar1);
      *pfVar6 = vVar8;
      iVar2 = iVar2 + -1;
      if (iVar9 == iVar2) break;
      pvVar5 = QVLABase<float>::operator[]
                         ((QVLABase<float> *)
                          CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),0x673a1f);
      in_stack_fffffffffffffb78 = *pvVar5;
      iVar1 = iVar1 + -1;
      pfVar6 = QDataBuffer<float>::at((QDataBuffer<float> *)in_RDI,(long)iVar1);
      *pfVar6 = in_stack_fffffffffffffb78;
      pvVar5 = QVLABase<float>::operator[]
                         ((QVLABase<float> *)
                          CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),0x673a61);
      in_stack_fffffffffffffb7c = *pvVar5;
      iVar1 = iVar1 + -1;
      pfVar6 = QDataBuffer<float>::at((QDataBuffer<float> *)in_RDI,(long)iVar1);
      *pfVar6 = in_stack_fffffffffffffb7c;
    }
    if (((uint)fromX & 0x1000000) != 0) {
      pfVar6 = QDataBuffer<float>::at((QDataBuffer<float> *)in_RDI,(long)(iVar1 + 1));
      in_stack_fffffffffffffb70 = *pfVar6;
      pfVar6 = QDataBuffer<float>::at((QDataBuffer<float> *)in_RDI,(long)(iVar1 + -1));
      *pfVar6 = in_stack_fffffffffffffb70;
      pfVar6 = QDataBuffer<float>::at((QDataBuffer<float> *)in_RDI,(long)iVar1);
      in_stack_fffffffffffffb74 = *pfVar6;
      pfVar6 = QDataBuffer<float>::at((QDataBuffer<float> *)in_RDI,(long)(iVar1 + -2));
      *pfVar6 = in_stack_fffffffffffffb74;
    }
    QVarLengthArray<float,_256LL>::~QVarLengthArray
              ((QVarLengthArray<float,_256LL> *)
               CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  }
  emitLineSegment((QTriangulatingStroker *)
                  CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                  in_stack_fffffffffffffb74,in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
                  in_stack_fffffffffffffb68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTriangulatingStroker::moveTo(const qreal *pts)
{
    m_cx = pts[0];
    m_cy = pts[1];

    float x2 = pts[2];
    float y2 = pts[3];
    normalVector(m_cx, m_cy, x2, y2, &m_nvx, &m_nvy);


    // To achieve jumps we insert zero-area tringles. This is done by
    // adding two identical points in both the end of previous strip
    // and beginning of next strip
    bool invisibleJump = m_vertices.size();

    switch (m_cap_style) {
    case Qt::FlatCap:
        if (invisibleJump) {
            m_vertices.add(m_cx + m_nvx);
            m_vertices.add(m_cy + m_nvy);
        }
        break;
    case Qt::SquareCap: {
        float sx = m_cx - m_nvy;
        float sy = m_cy + m_nvx;
        if (invisibleJump) {
            m_vertices.add(sx + m_nvx);
            m_vertices.add(sy + m_nvy);
        }
        emitLineSegment(sx, sy, m_nvx, m_nvy);
        break; }
    case Qt::RoundCap: {
        QVarLengthArray<float> points;
        arcPoints(m_cx, m_cy, m_cx + m_nvx, m_cy + m_nvy, m_cx - m_nvx, m_cy - m_nvy, points);
        m_vertices.resize(m_vertices.size() + points.size() + 2 * int(invisibleJump));
        int count = m_vertices.size();
        int front = 0;
        int end = points.size() / 2;
        while (front != end) {
            m_vertices.at(--count) = points[2 * end - 1];
            m_vertices.at(--count) = points[2 * end - 2];
            --end;
            if (front == end)
                break;
            m_vertices.at(--count) = points[2 * front + 1];
            m_vertices.at(--count) = points[2 * front + 0];
            ++front;
        }

        if (invisibleJump) {
            m_vertices.at(count - 1) = m_vertices.at(count + 1);
            m_vertices.at(count - 2) = m_vertices.at(count + 0);
        }
        break; }
    default: break; // ssssh gcc...
    }
    emitLineSegment(m_cx, m_cy, m_nvx, m_nvy);
}